

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O2

void __thiscall lsim::gui::CircuitEditor::draw_ui(CircuitEditor *this,UIContext *ui_context)

{
  Point *p;
  ComponentIcon *this_00;
  _Hash_node_base *p_Var1;
  ModelWire *this_01;
  SimCircuit *pSVar2;
  pointer pPVar3;
  ImVec2 cr_min;
  Point PVar4;
  Point PVar5;
  Transform transform;
  Transform transform_00;
  undefined1 auVar6 [16];
  bool bVar7;
  byte bVar8;
  bool bVar9;
  Value VVar10;
  node_t node_id;
  CircuitEditorState CVar11;
  ImDrawList *this_02;
  mapped_type *pmVar12;
  pin_id_t pVar13;
  Point *pPVar14;
  ModelWireSegment *segment;
  size_t sVar15;
  ImU32 IVar16;
  ImU32 col;
  pointer ptr_id;
  __node_base *p_Var17;
  size_t idx;
  ComponentWidget *pCVar18;
  __node_base *p_Var19;
  ulong uVar20;
  pointer this_03;
  float fVar21;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  Point endpoint_screen;
  Point endpoint_circuit;
  float local_d8 [2];
  Transform widget_to_screen;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  Point *local_80;
  undefined1 local_78 [16];
  pointer local_60;
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  ImVec2 local_40;
  Point local_38;
  
  uStack_90 = local_98;
  local_98 = (undefined1  [8])ui_context;
  this_02 = ImGui::GetWindowDrawList();
  widget_to_screen.m_el[0] = (float  [2])ImGui::GetCursorScreenPos();
  local_a0 = ImGui::GetCursorScreenPos();
  endpoint_circuit = ImVec2::operator_cast_to_Point(&local_a0);
  local_40 = ImGui::GetContentRegionMax();
  local_38 = ImVec2::operator_cast_to_Point(&local_40);
  endpoint_screen = Point::operator+(&endpoint_circuit,&local_38);
  ImGui::PushClipRect((ImVec2 *)&widget_to_screen,(ImVec2 *)&endpoint_screen,true);
  cr_min = ImGui::GetCursorScreenPos();
  endpoint_screen = (Point)ImGui::GetCursorScreenPos();
  widget_to_screen.m_el[0] = (float  [2])ImVec2::operator_cast_to_Point((ImVec2 *)&endpoint_screen);
  local_a0 = ImGui::GetContentRegionMax();
  endpoint_circuit = ImVec2::operator_cast_to_Point(&local_a0);
  PVar4 = Point::operator+((Point *)&widget_to_screen,&endpoint_circuit);
  ImDrawList::PushClipRect(this_02,cr_min,(ImVec2)PVar4,true);
  if (this->m_state != CS_SIMULATING) {
    draw_grid(this,this_02);
  }
  ui_popup_embed_circuit(this);
  ui_popup_sub_circuit(this,(UIContext *)local_98);
  ui_popup_edit_segment(this);
  ImDrawList::ChannelsSplit(this_02,2);
  ptr_id = (this->m_widgets).
           super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (this->m_widgets).
             super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  p = &this->m_screen_offset;
  local_98 = (undefined1  [8])&this->m_point_pin_lut;
  local_80 = &this->m_mouse_grid_point;
  for (; ptr_id != local_60; ptr_id = ptr_id + 1) {
    ImGui::PushID(ptr_id);
    pCVar18 = (ptr_id->_M_t).
              super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
              ._M_t.
              super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
              .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
    widget_to_screen.m_el[2] = *(float (*) [2])((long)(pCVar18->m_to_circuit).m_el + 0x10);
    widget_to_screen.m_el[0] = (pCVar18->m_to_circuit).m_el[0];
    widget_to_screen.m_el[1] = *(float (*) [2])((long)(pCVar18->m_to_circuit).m_el + 8);
    Transform::translate(&widget_to_screen,p);
    PVar4 = Point::operator+(&((ptr_id->_M_t).
                               super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                               .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                              _M_head_impl)->m_aabb_min,p);
    PVar5 = Point::operator+(&((ptr_id->_M_t).
                               super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                               .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                              _M_head_impl)->m_aabb_max,p);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = PVar5.x;
    local_78._4_4_ = PVar5.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    if (*(_Manager_type *)
         ((long)&(((ptr_id->_M_t).
                   super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                   .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl)->
                 m_draw_callback).super__Function_base + 0x10) != (_Manager_type)0x0) {
      endpoint_screen = PVar4;
      ImGui::SetCursorScreenPos((ImVec2 *)&endpoint_screen);
      ImDrawList::ChannelsSetCurrent(this_02,1);
      transform.m_el[1][0] = widget_to_screen.m_el[1][0];
      transform.m_el[1][1] = widget_to_screen.m_el[1][1];
      transform.m_el[0][0] = widget_to_screen.m_el[0][0];
      transform.m_el[0][1] = widget_to_screen.m_el[0][1];
      transform.m_el[2][0] = widget_to_screen.m_el[2][0];
      transform.m_el[2][1] = widget_to_screen.m_el[2][1];
      ComponentWidget::run_draw_callback
                ((ptr_id->_M_t).
                 super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                 .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl,this,
                 transform);
    }
    ImDrawList::ChannelsSetCurrent(this_02,0);
    endpoint_screen = PVar4;
    ImGui::SetCursorScreenPos((ImVec2 *)&endpoint_screen);
    endpoint_screen =
         ComponentWidget::aabb_size
                   ((ptr_id->_M_t).
                    super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                    .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl);
    ImGui::InvisibleButton("widget",(ImVec2 *)&endpoint_screen);
    pCVar18 = (ptr_id->_M_t).
              super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
              ._M_t.
              super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
              .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
    if ((pCVar18->m_tooltip)._M_string_length != 0) {
      bVar7 = ImGui::IsItemHovered(0);
      pCVar18 = (ptr_id->_M_t).
                super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                ._M_t.
                super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      if (bVar7) {
        ImGui::SetTooltip("%s",(pCVar18->m_tooltip)._M_dataplus._M_p);
        pCVar18 = (ptr_id->_M_t).
                  super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                  .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      }
    }
    bVar7 = is_selected(this,pCVar18);
    auVar6 = local_78;
    IVar16 = 0xffc8c8c8;
    if (bVar7) {
      endpoint_circuit.x = (float)local_78._0_4_;
      endpoint_circuit.y = (float)local_78._4_4_;
      endpoint_screen = PVar4;
      local_78 = auVar6;
      ImDrawList::AddRectFilled
                (this_02,(ImVec2 *)&endpoint_screen,(ImVec2 *)&endpoint_circuit,0xff006464,0.0,0xf);
      IVar16 = 0xffc8c8c8;
      if (this->m_state == CS_DRAGGING) {
        IVar16 = 0xff646464;
      }
      pCVar18 = (ptr_id->_M_t).
                super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                ._M_t.
                super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
    }
    auVar6 = local_78;
    bVar8 = pCVar18->m_border;
    if ((bool)bVar8 == true) {
      endpoint_circuit.x = (float)local_78._0_4_;
      endpoint_circuit.y = (float)local_78._4_4_;
      endpoint_screen = PVar4;
      local_78 = auVar6;
      ImDrawList::AddRect(this_02,(ImVec2 *)&endpoint_screen,(ImVec2 *)&endpoint_circuit,IVar16,0.0,
                          0xf,1.0);
      pCVar18 = (ptr_id->_M_t).
                super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                ._M_t.
                super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      bVar8 = pCVar18->m_border;
    }
    if (((bVar8 & 1) != 0) && (this_00 = pCVar18->m_icon, this_00 != (ComponentIcon *)0x0)) {
      local_48[0] = widget_to_screen.m_el[2][0];
      local_48[1] = widget_to_screen.m_el[2][1];
      local_58[0] = widget_to_screen.m_el[0][0];
      local_58[1] = widget_to_screen.m_el[0][1];
      afStack_50[0] = widget_to_screen.m_el[1][0];
      afStack_50[1] = widget_to_screen.m_el[1][1];
      endpoint_screen =
           ComponentWidget::aabb_size
                     ((ptr_id->_M_t).
                      super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                      .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl);
      Point::Point(&endpoint_circuit,10.0,10.0);
      PVar4 = Point::operator-(&endpoint_screen,&endpoint_circuit);
      transform_00.m_el[1][0] = afStack_50[0];
      transform_00.m_el[1][1] = afStack_50[1];
      transform_00.m_el[0][0] = local_58[0];
      transform_00.m_el[0][1] = local_58[1];
      transform_00.m_el[2][0] = local_48[0];
      transform_00.m_el[2][1] = local_48[1];
      ComponentIcon::draw(this_00,transform_00,PVar4,this_02,2,0xffc8c8c8);
    }
    bVar7 = ImGui::IsItemHovered(0);
    pCVar18 = (ptr_id->_M_t).
              super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
              ._M_t.
              super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
              .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
    if (bVar7) {
      this->m_hovered_widget = pCVar18;
    }
    p_Var17 = (__node_base *)((long)&(pCVar18->m_endpoints)._M_h + 0x10);
    while( true ) {
      p_Var17 = p_Var17->_M_nxt;
      if (p_Var17 == (__node_base *)0x0) break;
      endpoint_screen = Transform::apply(&widget_to_screen,(Point *)(p_Var17 + 2));
      endpoint_circuit = Point::operator-(&endpoint_screen,p);
      IVar16 = 0xff969696;
      if (this->m_state == CS_SIMULATING) {
        VVar10 = SimCircuit::pin_output(this->m_sim_circuit,(pin_id_t)p_Var17[1]._M_nxt);
        IVar16 = COLOR_CONNECTION[VVar10];
      }
      p_Var1 = p_Var17[1]._M_nxt;
      pmVar12 = std::__detail::
                _Map_base<lsim::Point,_std::pair<const_lsim::Point,_unsigned_long>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<lsim::Point>,_lsim::gui::CircuitEditor::PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<lsim::Point,_std::pair<const_lsim::Point,_unsigned_long>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<lsim::Point>,_lsim::gui::CircuitEditor::PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_98,&endpoint_circuit);
      *pmVar12 = (mapped_type)p_Var1;
      local_a0.x = endpoint_screen.x;
      local_a0.y = endpoint_screen.y;
      ImDrawList::AddCircleFilled(this_02,&local_a0,3.0,IVar16,0xc);
      fVar21 = distance_squared(local_80,&endpoint_circuit);
      if (fVar21 <= 2.0) {
        local_a0.x = endpoint_screen.x;
        local_a0.y = endpoint_screen.y;
        ImDrawList::AddCircle(this_02,&local_a0,8.0,0xc800ffff,0xc,2.0);
        this->m_hovered_pin = (pin_id_t)p_Var17[1]._M_nxt;
      }
    }
    ImGui::PopID();
  }
  p_Var19 = &(this->m_model_circuit->m_wires)._M_h._M_before_begin;
  while (p_Var1 = p_Var19->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
    this_01 = (ModelWire *)p_Var1[2]._M_nxt;
    IVar16 = 0xff787878;
    local_78._0_8_ = p_Var1;
    if ((this->m_state == CS_SIMULATING) &&
       ((this_01->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this_01->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      pSVar2 = this->m_sim_circuit;
      pVar13 = ModelWire::pin(this_01,0);
      VVar10 = SimCircuit::read_pin(pSVar2,pVar13);
      IVar16 = COLOR_CONNECTION[VVar10];
      pSVar2 = this->m_sim_circuit;
      pVar13 = ModelWire::pin(this_01,0);
      node_id = SimCircuit::pin_node(pSVar2,pVar13);
      bVar7 = SimCircuit::node_dirty(this->m_sim_circuit,node_id);
    }
    else {
      bVar7 = false;
    }
    for (uVar20 = 0;
        uVar20 < (ulong)((long)(this_01->m_segments).
                               super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_01->m_segments).
                               super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1)
    {
      pPVar14 = ModelWire::segment_point(this_01,uVar20,0);
      PVar4 = Point::operator+(pPVar14,p);
      unique0x100004cc = extraout_XMM0_Dc_00;
      local_98._0_4_ = PVar4.x;
      local_98._4_4_ = PVar4.y;
      unique0x100004d0 = extraout_XMM0_Dd_00;
      pPVar14 = ModelWire::segment_point(this_01,uVar20,1);
      PVar4 = Point::operator+(pPVar14,p);
      auVar6 = _local_98;
      if (bVar7 != false) {
        widget_to_screen.m_el[0][0] = (float)local_98._0_4_;
        widget_to_screen.m_el[0][1] = (float)local_98._4_4_;
        endpoint_screen = PVar4;
        _local_98 = auVar6;
        ImDrawList::AddLine(this_02,(ImVec2 *)&widget_to_screen,(ImVec2 *)&endpoint_screen,
                            0xaf969696,4.0);
      }
      segment = ModelWire::segment_by_index(this_01,uVar20);
      bVar9 = is_selected(this,segment);
      auVar6 = _local_98;
      col = IVar16;
      if (bVar9) {
        col = 0xff006464;
      }
      widget_to_screen.m_el[0][0] = (float)local_98._0_4_;
      widget_to_screen.m_el[0][1] = (float)local_98._4_4_;
      endpoint_screen = PVar4;
      _local_98 = auVar6;
      ImDrawList::AddLine(this_02,(ImVec2 *)&widget_to_screen,(ImVec2 *)&endpoint_screen,col,2.0);
    }
    for (uVar20 = 0;
        uVar20 < (ulong)((long)(this_01->m_junctions).
                               super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_01->m_junctions).
                               super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1)
    {
      sVar15 = ModelWire::junction_segment_count(this_01,uVar20);
      if (2 < sVar15) {
        pPVar14 = ModelWire::junction_position(this_01,uVar20);
        widget_to_screen.m_el[0] = (float  [2])Point::operator+(pPVar14,p);
        ImDrawList::AddCircleFilled(this_02,(ImVec2 *)&widget_to_screen,4.0,IVar16,0xc);
      }
    }
    p_Var19 = (__node_base *)local_78._0_8_;
    if (this->m_hovered_wire == (ModelWire *)0x0) {
      bVar7 = ModelWire::point_on_wire(this_01,local_80);
      if (bVar7) {
        widget_to_screen.m_el[0] = (float  [2])Point::operator+(local_80,p);
        ImDrawList::AddCircle(this_02,(ImVec2 *)&widget_to_screen,8.0,0xc800ffff,0xc,2.0);
        this->m_hovered_wire = this_01;
      }
    }
  }
  CVar11 = this->m_state;
  if (CVar11 == CS_AREA_SELECT) {
    PVar4 = Point::operator+(&this->m_area_sel_a,p);
    unique0x10000514 = extraout_XMM0_Dc_01;
    local_98._0_4_ = PVar4.x;
    local_98._4_4_ = PVar4.y;
    unique0x10000518 = extraout_XMM0_Dd_01;
    PVar4 = Point::operator+(local_80,p);
    ImGuiEx::RectFilled((ImVec2)local_98,(ImVec2)PVar4,0x80800000);
    CVar11 = this->m_state;
  }
  if (CVar11 == CS_CREATE_WIRE) {
    (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = this->m_mouse_grid_point;
    PVar4 = Point::operator+((this->m_line_anchors).
                             super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
                             super__Vector_impl_data._M_start,p);
    pPVar3 = (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    fVar21 = PVar4.x;
    fVar22 = PVar4.y;
    for (this_03 = (this->m_line_anchors).
                   super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
                   super__Vector_impl_data._M_start; this_03 != pPVar3; this_03 = this_03 + 1) {
      endpoint_screen = Point::operator+(this_03,p);
      unique0x1000055c = extraout_XMM0_Dc_02;
      local_98._0_4_ = endpoint_screen.x;
      local_98._4_4_ = endpoint_screen.y;
      unique0x10000560 = extraout_XMM0_Dd_02;
      widget_to_screen.m_el[0][0] = fVar21;
      widget_to_screen.m_el[0][1] = fVar22;
      ImDrawList::AddLine(this_02,(ImVec2 *)&widget_to_screen,(ImVec2 *)&endpoint_screen,0xffff0000,
                          4.0);
      fVar21 = (float)local_98._0_4_;
      fVar22 = (float)local_98._4_4_;
    }
  }
  ImDrawList::ChannelsMerge(this_02);
  ImGui::PopClipRect();
  ImDrawList::PopClipRect(this_02);
  return;
}

Assistant:

void CircuitEditor::draw_ui(UIContext *ui_context) {

	auto draw_list = ImGui::GetWindowDrawList();
	
	// clipping
	ImGui::PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);
	draw_list->PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);

	// grid
	if (!is_simulating()) {
		draw_grid(draw_list);
	}

	// potential popup windows
	ui_popup_embed_circuit();
	ui_popup_sub_circuit(ui_context);
	ui_popup_edit_segment();
	
	// create two layers to draw the background and the widgets
	draw_list->ChannelsSplit(2);

	// draw all widgets
	for (auto &widget : m_widgets) {

		ImGui::PushID(&widget);
		
		// setup
		Transform widget_to_screen = widget->to_circuit();
		widget_to_screen.translate(m_screen_offset);

		const auto widget_aabb_min = widget->aabb_min() + m_screen_offset;
		const auto widget_aabb_max = widget->aabb_max() + m_screen_offset;

		// custom draw routine
		if (widget->has_draw_callback()) {
			ImGui::SetCursorScreenPos(widget_aabb_min);
			draw_list->ChannelsSetCurrent(1);
			widget->run_draw_callback(this, widget_to_screen);
		}
	
		// invisible button used for widget selection
		draw_list->ChannelsSetCurrent(0);         // background
		ImGui::SetCursorScreenPos(widget_aabb_min);
		ImGui::InvisibleButton("widget", widget->aabb_size());

		// tooltip
		if (widget->has_tooltip() && ImGui::IsItemHovered()) {
			ImGui::SetTooltip("%s", widget->tooltip());
		}

		// draw border
		auto border_color = COLOR_COMPONENT_BORDER;

		if (is_selected(widget.get())) {
			draw_list->AddRectFilled(widget_aabb_min, widget_aabb_max, COLOR_COMPONENT_SELECTED);
			if (m_state == CS_DRAGGING) {
				border_color = COLOR_COMPONENT_BORDER_DRAGGING;
			}
		}

		if (widget->has_border()) {
  		  	draw_list->AddRect(widget_aabb_min, widget_aabb_max, border_color);
		}

		// draw icon
		if (widget->has_border() && widget->icon() != nullptr) {
    		widget->icon()->draw(widget_to_screen, widget->aabb_size() - Point(10,10), 
							   draw_list, 2, COLOR_COMPONENT_ICON);
		}

		// check for mouse hover
		if (ImGui::IsItemHovered()) {
			m_hovered_widget = widget.get();
		}

		// end points
		for (const auto &pair : widget->endpoints()) {
			// pair.first = pin-id ; pair.second = position
			auto endpoint_screen = widget_to_screen.apply(pair.second);
			auto endpoint_circuit = endpoint_screen - m_screen_offset;

			auto pin_color = COLOR_ENDPOINT;
			if (is_simulating()) {
				pin_color = COLOR_CONNECTION[m_sim_circuit->pin_output(pair.first)];
			}

			m_point_pin_lut[endpoint_circuit] = pair.first;

			draw_list->AddCircleFilled(endpoint_screen, 3, pin_color);

			if (distance_squared(m_mouse_grid_point, endpoint_circuit) <= 2) {
				draw_list->AddCircle(endpoint_screen, 8, COLOR_ENDPOINT_HOVER, 12, 2);
				m_hovered_pin = pair.first;
			}
		}

		ImGui::PopID();
	}

	// draw wires
	for (const auto &wire_it : m_model_circuit->wires()) {
		auto wire = wire_it.second.get();
		auto wire_color = COLOR_CONNECTION_UNDEFINED;
		bool dirty_node = false;

		// check color & highlight when simulation is running
		if (is_simulating() && wire->num_pins() > 0) {
			auto value = m_sim_circuit->read_pin(wire->pin(0));
			wire_color = COLOR_CONNECTION[value];

			auto node_id = m_sim_circuit->pin_node(wire->pin(0));
			dirty_node = m_sim_circuit->node_dirty(node_id);
		}

		// segments
		for (size_t idx = 0; idx < wire->num_segments(); ++idx) {
			const auto p0 = wire->segment_point(idx, 0) + m_screen_offset;
			const auto p1 = wire->segment_point(idx, 1) + m_screen_offset;

			if (dirty_node) {
				draw_list->AddLine(p0, p1, COLOR_CONNECTION_DIRTY, 4.0f);
			}

			auto segment_color = is_selected(wire->segment_by_index(idx)) ? COLOR_WIRE_SELECTED : wire_color;
			draw_list->AddLine(p0, p1, segment_color, 2.0f);
		}

		// draw junctions with more than 2 segments
		for (size_t idx = 0; idx < wire->num_junctions(); ++idx) {
			if (wire->junction_segment_count(idx) > 2) {
				draw_list->AddCircleFilled(wire->junction_position(idx) + m_screen_offset, 4, wire_color);
			}
		}
		
		// check for hovered wire
		if (m_hovered_wire == nullptr && wire->point_on_wire(m_mouse_grid_point)) {
			draw_list->AddCircle(m_mouse_grid_point + m_screen_offset, 8, COLOR_ENDPOINT_HOVER, 12, 2);
			m_hovered_wire = wire;
		}
	} 

	// draw area selection box
	if (m_state == CS_AREA_SELECT) {
		ImGuiEx::RectFilled(m_area_sel_a + m_screen_offset, m_mouse_grid_point + m_screen_offset, 
							IM_COL32(0, 0, 128, 128));
	}

	// draw wire under construction
	if (m_state == CS_CREATE_WIRE) {
		m_line_anchors.back() = m_mouse_grid_point;
		Point p0 = m_line_anchors.front() + m_screen_offset;

		for (const auto &anchor : m_line_anchors) {
			Point p1 = anchor + m_screen_offset;
			draw_list->AddLine(p0, p1, IM_COL32(0, 0, 255, 255), 4);
			p0 = p1;
		}
	}

	draw_list->ChannelsMerge();
	ImGui::PopClipRect();
	draw_list->PopClipRect();
}